

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeQADDInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint32_t uVar3;
  uint32_t Val;
  DecodeStatus DVar4;
  uint64_t in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  uint pred;
  uint Rn;
  uint Rm;
  uint Rd;
  DecodeStatus S;
  void *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint Insn_00;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  Insn_00 = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  RegNo = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x10,4);
  Val = fieldFromInstruction_4(in_ESI,0x1c,4);
  if (Val == 0xf) {
    local_4 = DecodeCPSInstruction
                        ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),Insn_00,in_RCX,
                         (void *)CONCAT44(local_4,uVar2));
  }
  else {
    DVar4 = DecodeGPRnopcRegisterClass
                      ((MCInst *)CONCAT44(local_4,uVar2),RegNo,
                       CONCAT44(Val,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
    if (_Var1) {
      DVar4 = DecodeGPRnopcRegisterClass
                        ((MCInst *)CONCAT44(local_4,uVar2),RegNo,
                         CONCAT44(Val,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
      if (_Var1) {
        DVar4 = DecodeGPRnopcRegisterClass
                          ((MCInst *)CONCAT44(local_4,uVar2),RegNo,
                           CONCAT44(Val,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
        if (_Var1) {
          DVar4 = DecodePredicateOperand
                            ((MCInst *)CONCAT44(RegNo,uVar3),Val,(uint64_t)in_stack_ffffffffffffffb8
                             ,(void *)0x2974f1);
          _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
          if (!_Var1) {
            local_4 = MCDisassembler_Fail;
          }
        }
        else {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeQADDInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);

	if (pred == 0xF)
		return DecodeCPSInstruction(Inst, Insn, Address, Decoder);

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}